

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O2

inform_dist * inform_dist_approximate(double *probs,size_t n,double tol)

{
  size_t i;
  size_t sVar1;
  uint32_t *data;
  inform_dist *piVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  
  if (n != 0 && probs != (double *)0x0) {
    dVar7 = 1.0;
    for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
      if (probs[sVar1] < 0.0) {
        return (inform_dist *)0x0;
      }
      dVar7 = dVar7 - probs[sVar1];
    }
    auVar6._8_4_ = (int)(n >> 0x20);
    auVar6._0_8_ = n;
    auVar6._12_4_ = 0x45300000;
    if ((ABS(dVar7) <=
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * ABS(tol)) &&
       (data = (uint32_t *)malloc(n * 4), data != (uint32_t *)0x0)) {
      for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
        data[sVar1] = (uint32_t)(long)(probs[sVar1] / ABS(tol));
      }
      uVar3 = *data;
      for (sVar1 = 1; sVar1 != n; sVar1 = sVar1 + 1) {
        uVar5 = (ulong)data[sVar1];
        while (uVar4 = (uint)uVar5, uVar4 != 0) {
          uVar5 = (ulong)uVar3 % uVar5;
          uVar3 = uVar4;
        }
      }
      for (sVar1 = 0; n != sVar1; sVar1 = sVar1 + 1) {
        data[sVar1] = data[sVar1] / uVar3;
      }
      piVar2 = inform_dist_create(data,n);
      free(data);
      return piVar2;
    }
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_approximate(double const *probs, size_t n, double tol)
{
    if (probs == NULL || n == 0)
    {
        return NULL;
    }
    tol = fabs(tol);
    // check the validity of the probability distribution
    double diff = 1.0;
    for (size_t i = 0; i < n; ++i)
    {
        diff -= probs[i];
        if (probs[i] < 0.0) return NULL;
    }
    if (fabs(diff) > (double)n * tol)
    {
        return NULL;
    }
    // determine the number of counts
    uint32_t *counts = malloc(n * sizeof(int));
    if (counts == NULL)
    {
        return NULL;
    }
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] = (uint32_t)(probs[i] / tol);
    }
    int g = gcd(counts, n);
    for (size_t i = 0; i < n; ++i)
    {
        counts[i] /= g;
    }
    // create the distribution
    inform_dist *dist = inform_dist_create(counts, n);
    free(counts);
    return dist;
}